

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Get_Glyph_Name(FT_Face face,FT_UInt glyph_index,FT_Pointer buffer,FT_UInt buffer_max)

{
  FT_Module_Requester p_Var1;
  FT_Error FVar2;
  undefined8 *puVar3;
  FT_Face_Internal pFVar4;
  undefined8 *puVar5;
  
  if (face == (FT_Face)0x0) {
    FVar2 = 0x23;
  }
  else {
    if (buffer_max != 0 && buffer != (FT_Pointer)0x0) {
      *(undefined1 *)buffer = 0;
      if (face->num_glyphs <= (long)(ulong)glyph_index) {
        return 0x10;
      }
      if ((face->face_flags & 0x200) != 0) {
        pFVar4 = face->internal;
        puVar3 = (undefined8 *)(pFVar4->services).service_GLYPH_DICT;
        if (puVar3 != (undefined8 *)0xfffffffffffffffe) {
          if (puVar3 == (undefined8 *)0x0) {
            p_Var1 = ((face->driver->root).clazz)->get_interface;
            if (p_Var1 == (FT_Module_Requester)0x0) {
              puVar3 = (undefined8 *)0x0;
            }
            else {
              puVar3 = (undefined8 *)(*p_Var1)(&face->driver->root,"glyph-dict");
              pFVar4 = face->internal;
            }
            puVar5 = (undefined8 *)0xfffffffffffffffe;
            if (puVar3 != (undefined8 *)0x0) {
              puVar5 = puVar3;
            }
            (pFVar4->services).service_GLYPH_DICT = puVar5;
          }
          if (puVar3 != (undefined8 *)0x0) {
            if ((code *)*puVar3 == (code *)0x0) {
              return 6;
            }
            FVar2 = (*(code *)*puVar3)(face,glyph_index,buffer,buffer_max);
            return FVar2;
          }
        }
      }
    }
    FVar2 = 6;
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Glyph_Name( FT_Face     face,
                     FT_UInt     glyph_index,
                     FT_Pointer  buffer,
                     FT_UInt     buffer_max )
  {
    FT_Error              error;
    FT_Service_GlyphDict  service;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !buffer || buffer_max == 0 )
      return FT_THROW( Invalid_Argument );

    /* clean up buffer */
    ((FT_Byte*)buffer)[0] = '\0';

    if ( (FT_Long)glyph_index >= face->num_glyphs )
      return FT_THROW( Invalid_Glyph_Index );

    if ( !FT_HAS_GLYPH_NAMES( face ) )
      return FT_THROW( Invalid_Argument );

    FT_FACE_LOOKUP_SERVICE( face, service, GLYPH_DICT );
    if ( service && service->get_name )
      error = service->get_name( face, glyph_index, buffer, buffer_max );
    else
      error = FT_THROW( Invalid_Argument );

    return error;
  }